

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void AdjustOpenGLLogicalScalingVector(int *x,int *y,float *rx,float *ry)

{
  SDL20_floor_t *pp_Var1;
  SDL20_floor_t *pp_Var2;
  float fVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  SDL_Rect SVar7;
  int physical_h;
  int physical_w;
  int local_28;
  int local_24;
  
  if (VideoWindow20 != (SDL_Window *)0x0 && OpenGLLogicalScalingFBO != 0) {
    (*SDL20_GetWindowSize)(VideoWindow20,&local_24,&local_28);
    SVar7 = GetOpenGLLogicalScalingViewport(local_24,local_28);
    fVar6 = (float)*x * ((float)OpenGLLogicalScalingWidth / (float)SVar7.w) +
            MouseRelativeRemainder_0;
    fVar3 = (float)*y * ((float)OpenGLLogicalScalingHeight / (float)SVar7.h) +
            MouseRelativeRemainder_1;
    pp_Var2 = &SDL20_floor;
    pp_Var1 = &SDL20_floor;
    if (fVar6 < 0.0) {
      pp_Var1 = &SDL20_ceil;
    }
    dVar4 = (**pp_Var1)((double)fVar6);
    if (fVar3 < 0.0) {
      pp_Var2 = &SDL20_ceil;
    }
    dVar5 = (**pp_Var2)((double)fVar3);
    *x = (int)dVar4;
    *y = (int)dVar5;
    MouseRelativeRemainder_0 = fVar6 - (float)dVar4;
    MouseRelativeRemainder_1 = fVar3 - (float)dVar5;
  }
  return;
}

Assistant:

static void
AdjustOpenGLLogicalScalingVector(int *x, int *y, float *rx, float *ry)
{
    SDL_Rect viewport;
    int physical_w, physical_h;
    float scale_x, scale_y;
    float float_x, float_y;
    float trunc_x, trunc_y;

    /* Don't adjust anything if we're not using Logical Scaling */
    if (!OpenGLLogicalScalingFBO || !VideoWindow20) {
        return;
    }

    /* we want to scale based on the window size, which is dpi-scaled */
    SDL20_GetWindowSize(VideoWindow20, &physical_w, &physical_h);
    viewport = GetOpenGLLogicalScalingViewport(physical_w, physical_h);

    scale_x = (float)OpenGLLogicalScalingWidth / viewport.w;
    scale_y = (float)OpenGLLogicalScalingHeight / viewport.h;

    float_x = *x * scale_x + (rx ? *rx : 0.f);
    float_y = *y * scale_y + (ry ? *ry : 0.f);

    trunc_x = SDL20_truncf(float_x);
    trunc_y = SDL20_truncf(float_y);

    *x = (int)trunc_x;
    *y = (int)trunc_y;

    if (rx) {
        *rx = float_x - trunc_x;
    }
    if (ry) {
        *ry = float_y - trunc_y;
    }
}